

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O0

void Llb_ManPrepareVarLimits(Llb_Man_t *p)

{
  Llb_Grp_t *pLVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  int local_28;
  int local_24;
  int k;
  int i;
  Aig_Obj_t *pVar;
  Llb_Grp_t *pGroup;
  Llb_Man_t *p_local;
  
  if (p->vVarBegs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarBegs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x5d,"void Llb_ManPrepareVarLimits(Llb_Man_t *)");
  }
  if (p->vVarEnds != (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarEnds == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x5e,"void Llb_ManPrepareVarLimits(Llb_Man_t *)");
  }
  iVar2 = Aig_ManObjNumMax(p->pAig);
  pVVar3 = Vec_IntStart(iVar2);
  p->vVarEnds = pVVar3;
  iVar2 = Aig_ManObjNumMax(p->pAig);
  pVVar3 = Vec_IntStart(iVar2);
  p->vVarBegs = pVVar3;
  pVVar3 = p->vVarBegs;
  iVar2 = Aig_ManObjNumMax(p->pAig);
  Vec_IntFill(pVVar3,iVar2,p->pMatrix->nCols);
  for (local_24 = 0; local_24 < p->pMatrix->nCols; local_24 = local_24 + 1) {
    pLVar1 = p->pMatrix->pColGrps[local_24];
    for (local_28 = 0; iVar2 = Vec_PtrSize(pLVar1->vIns), local_28 < iVar2; local_28 = local_28 + 1)
    {
      pvVar4 = Vec_PtrEntry(pLVar1->vIns,local_28);
      iVar2 = Vec_IntEntry(p->vVarBegs,*(int *)((long)pvVar4 + 0x24));
      if (local_24 < iVar2) {
        Vec_IntWriteEntry(p->vVarBegs,*(int *)((long)pvVar4 + 0x24),local_24);
      }
    }
    for (local_28 = 0; iVar2 = Vec_PtrSize(pLVar1->vOuts), local_28 < iVar2; local_28 = local_28 + 1
        ) {
      pvVar4 = Vec_PtrEntry(pLVar1->vOuts,local_28);
      iVar2 = Vec_IntEntry(p->vVarBegs,*(int *)((long)pvVar4 + 0x24));
      if (local_24 < iVar2) {
        Vec_IntWriteEntry(p->vVarBegs,*(int *)((long)pvVar4 + 0x24),local_24);
      }
    }
    for (local_28 = 0; iVar2 = Vec_PtrSize(pLVar1->vIns), local_28 < iVar2; local_28 = local_28 + 1)
    {
      pvVar4 = Vec_PtrEntry(pLVar1->vIns,local_28);
      iVar2 = Vec_IntEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24));
      if (iVar2 < local_24) {
        Vec_IntWriteEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24),local_24);
      }
    }
    for (local_28 = 0; iVar2 = Vec_PtrSize(pLVar1->vOuts), local_28 < iVar2; local_28 = local_28 + 1
        ) {
      pvVar4 = Vec_PtrEntry(pLVar1->vOuts,local_28);
      iVar2 = Vec_IntEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24));
      if (iVar2 < local_24) {
        Vec_IntWriteEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24),local_24);
      }
    }
  }
  return;
}

Assistant:

void Llb_ManPrepareVarLimits( Llb_Man_t * p )
{
    Llb_Grp_t * pGroup;
    Aig_Obj_t * pVar;
    int i, k;
    assert( p->vVarBegs == NULL );
    assert( p->vVarEnds == NULL );
    p->vVarEnds = Vec_IntStart( Aig_ManObjNumMax(p->pAig) ); 
    p->vVarBegs = Vec_IntStart( Aig_ManObjNumMax(p->pAig) ); 
    Vec_IntFill( p->vVarBegs, Aig_ManObjNumMax(p->pAig), p->pMatrix->nCols );

    for ( i = 0; i < p->pMatrix->nCols; i++ )
    {
        pGroup = p->pMatrix->pColGrps[i];

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) > i )
                Vec_IntWriteEntry( p->vVarBegs, pVar->Id, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) > i )
                Vec_IntWriteEntry( p->vVarBegs, pVar->Id, i );

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) < i )
                Vec_IntWriteEntry( p->vVarEnds, pVar->Id, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) < i )
                Vec_IntWriteEntry( p->vVarEnds, pVar->Id, i );
    }
}